

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O2

int dwarf_get_GNUIKIND_name(uint val,char **s_out)

{
  if (val < 5) {
    *s_out = &DAT_0020009c + *(int *)(&DAT_0020009c + (ulong)val * 4);
    return 0;
  }
  return -1;
}

Assistant:

int
dwarf_get_GNUIKIND_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_GNUIKIND_none:
        *s_out = "DW_GNUIKIND_none";
        return DW_DLV_OK;
    case DW_GNUIKIND_type:
        *s_out = "DW_GNUIKIND_type";
        return DW_DLV_OK;
    case DW_GNUIKIND_variable:
        *s_out = "DW_GNUIKIND_variable";
        return DW_DLV_OK;
    case DW_GNUIKIND_function:
        *s_out = "DW_GNUIKIND_function";
        return DW_DLV_OK;
    case DW_GNUIKIND_other:
        *s_out = "DW_GNUIKIND_other";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}